

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::reserveVars(Solver *this,Var v)

{
  vec<char> *pvVar1;
  undefined8 in_RAX;
  int size;
  int iVar2;
  undefined8 uStack_38;
  
  size = v * 2 + 1;
  uStack_38 = in_RAX;
  vec<Minisat::vec<Minisat::Watcher>_>::growTo(&(this->watches_bin).occs,size);
  pvVar1 = &(this->watches_bin).dirty;
  uStack_38._0_5_ = (uint5)(uint)uStack_38;
  vec<char>::growTo(pvVar1,size,(char *)((long)&uStack_38 + 4));
  iVar2 = v * 2 + 2;
  vec<Minisat::vec<Minisat::Watcher>_>::growTo(&(this->watches_bin).occs,iVar2);
  uStack_38._0_6_ = (uint6)(uint5)uStack_38;
  vec<char>::growTo(pvVar1,iVar2,(char *)((long)&uStack_38 + 5));
  vec<Minisat::vec<Minisat::Watcher>_>::growTo(&(this->watches).occs,size);
  pvVar1 = &(this->watches).dirty;
  uStack_38._0_7_ = (uint7)(uint6)uStack_38;
  vec<char>::growTo(pvVar1,size,(char *)((long)&uStack_38 + 6));
  vec<Minisat::vec<Minisat::Watcher>_>::growTo(&(this->watches).occs,iVar2);
  uStack_38 = uStack_38 & 0xffffffffffffff;
  vec<char>::growTo(pvVar1,iVar2,(char *)((long)&uStack_38 + 7));
  iVar2 = v + 1;
  vec<Minisat::lbool>::capacity(&this->assigns,iVar2);
  vec<Minisat::Solver::VarData>::capacity(&this->vardata,iVar2);
  vec<unsigned_int>::capacity(&this->oldreasons,iVar2);
  vec<double>::capacity(&this->activity_CHB,iVar2);
  vec<double>::capacity(&this->activity_VSIDS,iVar2);
  vec<double>::capacity(&this->activity_distance,iVar2);
  vec<unsigned_int>::capacity(&this->picked,iVar2);
  vec<unsigned_int>::capacity(&this->conflicted,iVar2);
  vec<unsigned_int>::capacity(&this->almost_conflicted,iVar2);
  vec<unsigned_int>::capacity(&this->canceled,iVar2);
  vec<char>::capacity(&this->seen,iVar2);
  vec<unsigned_long>::capacity(&this->seen2,size);
  vec<char>::capacity(&this->polarity,iVar2);
  vec<char>::capacity(&this->decision,iVar2);
  vec<Minisat::Lit>::capacity(&this->trail,iVar2);
  vec<Minisat::Lit>::capacity(&this->old_trail,iVar2);
  vec<double>::capacity(&this->var_iLevel,iVar2);
  vec<double>::capacity(&this->var_iLevel_tmp,iVar2);
  vec<int>::capacity(&this->pathCs,iVar2);
  return;
}

Assistant:

void Solver::reserveVars(Var v)
{
    watches_bin.init(mkLit(v, false));
    watches_bin.init(mkLit(v, true));
    watches.init(mkLit(v, false));
    watches.init(mkLit(v, true));
    assigns.capacity(v + 1);
    vardata.capacity(v + 1);
    oldreasons.capacity(v + 1);
    activity_CHB.capacity(v + 1);
    activity_VSIDS.capacity(v + 1);
    activity_distance.capacity(v + 1);

    picked.capacity(v + 1);
    conflicted.capacity(v + 1);
    almost_conflicted.capacity(v + 1);
#ifdef ANTI_EXPLORATION
    canceled.capacity(v + 1);
#endif

    seen.capacity(v + 1);
    seen2.capacity(2 * v + 1);
    polarity.capacity(v + 1);
    decision.capacity(v + 1);
    trail.capacity(v + 1);
    old_trail.capacity(v + 1);

    var_iLevel.capacity(v + 1);
    var_iLevel_tmp.capacity(v + 1);
    pathCs.capacity(v + 1);
}